

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

String * __thiscall
capnp::JsonCodec::encode<capnp::TestBase64Union::Builder&>
          (String *__return_storage_ptr__,JsonCodec *this,Builder *value)

{
  Type type;
  Reader local_90;
  size_t local_48;
  SegmentReader *pSStack_40;
  CapTableReader *local_38;
  byte *pbStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  capnp::_::StructBuilder::asReader(&value->_builder);
  local_90.field_1._40_8_ = local_28;
  local_90.field_1._48_8_ = uStack_20;
  local_90.field_1.listValue.reader.capTable = local_38;
  local_90.field_1.listValue.reader.ptr = pbStack_30;
  local_90.field_1.textValue.super_StringPtr.content.size_ = local_48;
  local_90.field_1.listValue.reader.segment = pSStack_40;
  local_90.type = STRUCT;
  local_90.field_1.floatValue = 3.32742935908646e-317;
  type.field_4.schema = (RawBrandedSchema *)(schemas::s_e36a2dc2a7ba9f0a + 0x48);
  type.baseType = STRUCT;
  type.listDepth = '\0';
  type.isImplicitParam = false;
  type.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
  type._6_2_ = 0;
  encode(__return_storage_ptr__,this,&local_90,type);
  DynamicValue::Reader::~Reader(&local_90);
  return __return_storage_ptr__;
}

Assistant:

kj::String JsonCodec::encode(T&& value) const {
  Type type = Type::from(value);
  typedef FromAny<kj::Decay<T>> Base;
  return encode(DynamicValue::Reader(ReaderFor<Base>(kj::fwd<T>(value))), type);
}